

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinAsciiUpper
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  allocator_type *in_RCX;
  ulong uVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar2;
  allocator<char> local_59;
  UString new_str;
  Type local_34;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&new_str,"asciiUpper",&local_59);
  local_34 = STRING;
  __l._M_len = 1;
  __l._M_array = &local_34;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_30,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&new_str,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_30);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_30);
  std::__cxx11::string::~string((string *)&new_str);
  std::__cxx11::u32string::u32string
            ((u32string *)&new_str,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             ((((args->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  for (uVar1 = 0; uVar1 < new_str._M_string_length; uVar1 = uVar1 + 1) {
    if ((uint)(new_str._M_dataplus._M_p[uVar1] + L'\xffffff9f') < 0x1a) {
      new_str._M_dataplus._M_p[uVar1] = new_str._M_dataplus._M_p[uVar1] + L'\xffffffe0';
    }
  }
  VVar2 = makeString(this,&new_str);
  (this->scratch).t = STRING;
  (this->scratch).v = VVar2._0_8_;
  std::__cxx11::u32string::~u32string((u32string *)&new_str);
  return (AST *)0x0;
}

Assistant:

const AST *builtinAsciiUpper(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "asciiUpper", args, {Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        UString new_str(str->value);
        for (size_t i = 0; i < new_str.size(); ++i) {
            if (new_str[i] >= 'a' && new_str[i] <= 'z') {
                new_str[i] = new_str[i] - 'a' + 'A';
            }
        }
        scratch = makeString(new_str);
        return nullptr;
    }